

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registrations.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
* __thiscall miniros::master::Registrations::getState_abi_cxx11_(Registrations *this)

{
  bool bVar1;
  reference ppVar2;
  value_type *in_RDI;
  Record *obj;
  const_iterator __end3;
  const_iterator __begin3;
  vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *providers;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>
  *pair;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *result;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
  *in_stack_ffffffffffffff68;
  mapped_type *in_stack_ffffffffffffff70;
  value_type *this_00;
  __normal_iterator<const_miniros::master::Registrations::Record_*,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>
  local_60;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  _Self local_30;
  _Self local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x53cbee);
  local_28[0]._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_30._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while (bVar1 = ::std::operator!=(local_28,&local_30), bVar1) {
    ppVar2 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>
                          *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff70 =
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = (key_type *)&ppVar2->second;
    local_60._M_current =
         (Record *)
         ::std::
         vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>
         ::begin((vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>
                  *)in_stack_ffffffffffffff68);
    ::std::
    vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>
    ::end((vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>
           *)in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_miniros::master::Registrations::Record_*,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_miniros::master::Registrations::Record_*,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_miniros::master::Registrations::Record_*,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>
      ::operator*(&local_60);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,in_RDI);
      __gnu_cxx::
      __normal_iterator<const_miniros::master::Registrations::Record_*,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>
      ::operator++(&local_60);
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<miniros::master::Registrations::Record,_std::allocator<miniros::master::Registrations::Record>_>_>_>
                  *)in_stack_ffffffffffffff70);
  }
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)this_00;
}

Assistant:

std::map<std::string, std::vector<std::string>> Registrations::getState() const
{
  // It must return a collection of node names.
  // Also, node duplicates must be cleaned up.
  std::map<std::string, std::vector<std::string>> result;

  for (const auto& pair : map) {
    std::vector<std::string>& providers = result[pair.first];
    for (const Record& obj : pair.second) {
      providers.push_back(obj.caller_id);
    }
  }
  return result;
}